

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_uint32_iterator_move_equalorlarger(roaring_uint32_iterator_t *it,uint32_t val)

{
  uint8_t uVar1;
  ushort uVar2;
  roaring_bitmap_t *prVar3;
  uint16_t *puVar4;
  _Bool _Var5;
  ushort uVar6;
  roaring_container_iterator_t rVar7;
  ulong in_RAX;
  long lVar8;
  uint uVar9;
  bitset_container_t *container;
  uint uVar10;
  int iVar11;
  uint16_t value;
  undefined8 uStack_28;
  
  prVar3 = it->parent;
  iVar11 = (prVar3->high_low_container).size;
  if ((long)iVar11 == 0) {
LAB_001112a4:
    uVar10 = iVar11 - 1;
LAB_001112a7:
    if ((int)uVar10 < 0) goto LAB_001113c7;
LAB_001112b3:
    container = (bitset_container_t *)(prVar3->high_low_container).containers[uVar10];
    uVar1 = (prVar3->high_low_container).typecodes[uVar10];
    if (uVar1 == '\x04') {
      uVar1 = *(uint8_t *)&container->words;
      container = *(bitset_container_t **)container;
    }
    uStack_28 = in_RAX;
    if (uVar1 == '\x03') {
      lVar8 = (long)container->cardinality;
      if (lVar8 == 0) {
LAB_00111352:
        uVar6 = 0;
      }
      else {
        uVar6 = *(short *)((long)container->words + lVar8 * 4 + -2) +
                *(short *)((long)container->words + lVar8 * 4 + -4);
      }
    }
    else if (uVar1 == '\x02') {
      if ((long)container->cardinality == 0) goto LAB_00111352;
      uVar6 = *(ushort *)((long)container->words + (long)container->cardinality * 2 + -2);
    }
    else {
      uVar6 = bitset_container_maximum(container);
    }
    if ((val & 0xffff) <= (uint)uVar6) {
      it->container_index = uVar10;
      _Var5 = iter_new_container_partial_init(it);
      if (_Var5) {
        uStack_28 = uStack_28 & 0xffffffffffff;
        rVar7 = container_init_iterator
                          (it->container,it->typecode,(uint16_t *)((long)&uStack_28 + 6));
        (it->container_it).index = rVar7.index;
        _Var5 = container_iterator_lower_bound
                          (it->container,it->typecode,&it->container_it,
                           (uint16_t *)((long)&uStack_28 + 6),(uint16_t)val);
        if (_Var5) {
          it->current_value = (uint)uStack_28._6_2_ | it->highbits;
        }
      }
      else {
        _Var5 = false;
      }
      goto LAB_001113d6;
    }
    uVar10 = uVar10 + 1;
  }
  else {
    puVar4 = (prVar3->high_low_container).keys;
    uVar6 = (ushort)(val >> 0x10);
    if (puVar4[(long)iVar11 + -1] == uVar6) goto LAB_001112a4;
    if (0 < iVar11) {
      iVar11 = iVar11 + -1;
      uVar9 = 0;
      do {
        uVar10 = iVar11 + uVar9 >> 1;
        uVar2 = *(ushort *)((long)puVar4 + (ulong)(iVar11 + uVar9 & 0xfffffffe));
        if (uVar2 < uVar6) {
          uVar9 = uVar10 + 1;
        }
        else {
          if (uVar2 <= uVar6) goto LAB_001112b3;
          iVar11 = uVar10 - 1;
        }
      } while ((int)uVar9 <= iVar11);
      uVar10 = ~uVar9;
      goto LAB_001112a7;
    }
    uVar10 = 0xffffffff;
LAB_001113c7:
    uVar10 = ~uVar10;
  }
  it->container_index = uVar10;
  _Var5 = loadfirstvalue(it);
LAB_001113d6:
  it->has_value = _Var5;
  return _Var5;
}

Assistant:

bool roaring_uint32_iterator_move_equalorlarger(roaring_uint32_iterator_t *it,
                                                uint32_t val) {
    uint16_t hb = val >> 16;
    const int i = ra_get_index(&it->parent->high_low_container, hb);
    if (i >= 0) {
        uint32_t lowvalue =
            container_maximum(it->parent->high_low_container.containers[i],
                              it->parent->high_low_container.typecodes[i]);
        uint16_t lb = val & 0xFFFF;
        if (lowvalue < lb) {
            // will have to load first value of next container
            it->container_index = i + 1;
        } else {
            // the value is necessarily within the range of the container
            it->container_index = i;
            it->has_value = loadfirstvalue_largeorequal(it, val);
            return it->has_value;
        }
    } else {
        // there is no matching, so we are going for the next container
        it->container_index = -i - 1;
    }
    it->has_value = loadfirstvalue(it);
    return it->has_value;
}